

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O3

int32_t createTagStringWithAlternates
                  (char *lang,int32_t langLength,char *script,int32_t scriptLength,char *region,
                  int32_t regionLength,char *trailing,int32_t trailingLength,char *alternateTags,
                  char *tag,int32_t tagCapacity,UErrorCode *err)

{
  bool bVar1;
  UErrorCode UVar2;
  int32_t iVar3;
  long lVar4;
  uint uVar5;
  size_t __n;
  char alternateRegion [4];
  char local_e4 [12];
  undefined2 local_d8;
  undefined1 local_d6;
  
  UVar2 = *err;
  if (U_ZERO_ERROR < UVar2) {
LAB_00311548:
    if (UVar2 != U_BUFFER_OVERFLOW_ERROR && U_ZERO_ERROR < UVar2) {
      return -1;
    }
LAB_003115c3:
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  if ((((3 < regionLength) || (5 < scriptLength)) || (0xb < langLength)) || (tag == (char *)0x0))
  goto LAB_003115c3;
  if (langLength < 1) {
    if (alternateTags != (char *)0x0) {
      langLength = uloc_getLanguage_63(alternateTags,local_e4,0xc,err);
      UVar2 = *err;
      if (0xb < langLength || U_ZERO_ERROR < UVar2) goto LAB_00311548;
      if (langLength != 0) {
        __n = (size_t)langLength;
        lang = local_e4;
        goto LAB_003115a3;
      }
      local_d6 = 100;
      local_d8 = 0x6e75;
      langLength = 3;
      goto LAB_003115a8;
    }
    local_d6 = 100;
    local_d8 = 0x6e75;
    langLength = 3;
    if (0 < scriptLength) goto LAB_003116ae;
    langLength = 3;
    if (regionLength < 1) goto LAB_0031178b;
LAB_003116e3:
    *(undefined1 *)((long)&local_d8 + (ulong)(uint)langLength) = 0x5f;
    langLength = langLength + 1;
LAB_003116ee:
    memcpy((void *)((long)&local_d8 + (long)langLength),region,(ulong)(uint)regionLength);
    langLength = langLength + regionLength;
    bVar1 = true;
  }
  else {
    __n = (size_t)(uint)langLength;
LAB_003115a3:
    memcpy(&local_d8,lang,__n);
LAB_003115a8:
    if (scriptLength < 1) {
      if (alternateTags != (char *)0x0) {
        uVar5 = uloc_getScript_63(alternateTags,local_e4,6,err);
        UVar2 = *err;
        if (5 < (int)uVar5 || U_ZERO_ERROR < UVar2) goto LAB_00311548;
        if (0 < (int)uVar5) {
          if (0 < langLength) {
            *(undefined1 *)((long)&local_d8 + (ulong)(uint)langLength) = 0x5f;
            langLength = langLength + 1;
          }
          memcpy((void *)((long)&local_d8 + (long)langLength),local_e4,(ulong)uVar5);
          langLength = langLength + uVar5;
        }
        goto LAB_003116da;
      }
      if (0 < regionLength) goto LAB_003116de;
    }
    else {
      if (0 < langLength) {
LAB_003116ae:
        *(undefined1 *)((long)&local_d8 + (ulong)(uint)langLength) = 0x5f;
        langLength = langLength + 1;
      }
      memcpy((void *)((long)&local_d8 + (long)langLength),script,(ulong)(uint)scriptLength);
      langLength = langLength + scriptLength;
LAB_003116da:
      if (0 < regionLength) {
LAB_003116de:
        if (0 < langLength) goto LAB_003116e3;
        goto LAB_003116ee;
      }
      if (alternateTags != (char *)0x0) {
        uVar5 = uloc_getCountry_63(alternateTags,local_e4,4,err);
        UVar2 = *err;
        if ((int)uVar5 < 4 && UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
          bVar1 = 0 < (int)uVar5;
          if (0 < (int)uVar5) {
            if (0 < langLength) {
              *(undefined1 *)((long)&local_d8 + (ulong)(uint)langLength) = 0x5f;
              langLength = langLength + 1;
            }
            memcpy((void *)((long)&local_d8 + (long)langLength),local_e4,(ulong)uVar5);
            langLength = langLength + uVar5;
          }
          goto LAB_0031178e;
        }
        goto LAB_00311548;
      }
    }
LAB_0031178b:
    bVar1 = false;
  }
LAB_0031178e:
  uVar5 = tagCapacity;
  if (langLength < tagCapacity) {
    uVar5 = langLength;
  }
  memcpy(tag,&local_d8,(long)(int)uVar5);
  if (0 < trailingLength) {
    uVar5 = tagCapacity - uVar5;
    if ((*trailing != '@') && (0 < (int)uVar5)) {
      tag[langLength] = '_';
      lVar4 = (long)langLength + 1;
      if (bVar1 || uVar5 < 2) {
        uVar5 = uVar5 - 1;
        langLength = (int32_t)lVar4;
      }
      else {
        langLength = langLength + 2;
        tag[lVar4] = '_';
        uVar5 = uVar5 - 2;
      }
    }
    if (0 < (int)uVar5) {
      if ((uint)trailingLength <= uVar5) {
        uVar5 = trailingLength;
      }
      memmove(tag + langLength,trailing,(ulong)uVar5);
    }
  }
  iVar3 = u_terminateChars_63(tag,tagCapacity,langLength + trailingLength,err);
  return iVar3;
}

Assistant:

static int32_t U_CALLCONV
createTagStringWithAlternates(
    const char* lang,
    int32_t langLength,
    const char* script,
    int32_t scriptLength,
    const char* region,
    int32_t regionLength,
    const char* trailing,
    int32_t trailingLength,
    const char* alternateTags,
    char* tag,
    int32_t tagCapacity,
    UErrorCode* err) {

    if (U_FAILURE(*err)) {
        goto error;
    }
    else if (tag == NULL ||
             tagCapacity <= 0 ||
             langLength >= ULOC_LANG_CAPACITY ||
             scriptLength >= ULOC_SCRIPT_CAPACITY ||
             regionLength >= ULOC_COUNTRY_CAPACITY) {
        goto error;
    }
    else {
        /**
         * ULOC_FULLNAME_CAPACITY will provide enough capacity
         * that we can build a string that contains the language,
         * script and region code without worrying about overrunning
         * the user-supplied buffer.
         **/
        char tagBuffer[ULOC_FULLNAME_CAPACITY];
        int32_t tagLength = 0;
        int32_t capacityRemaining = tagCapacity;
        UBool regionAppended = FALSE;

        if (langLength > 0) {
            appendTag(
                lang,
                langLength,
                tagBuffer,
                &tagLength);
        }
        else if (alternateTags == NULL) {
            /*
             * Append the value for an unknown language, if
             * we found no language.
             */
            appendTag(
                unknownLanguage,
                (int32_t)uprv_strlen(unknownLanguage),
                tagBuffer,
                &tagLength);
        }
        else {
            /*
             * Parse the alternateTags string for the language.
             */
            char alternateLang[ULOC_LANG_CAPACITY];
            int32_t alternateLangLength = sizeof(alternateLang);

            alternateLangLength =
                uloc_getLanguage(
                    alternateTags,
                    alternateLang,
                    alternateLangLength,
                    err);
            if(U_FAILURE(*err) ||
                alternateLangLength >= ULOC_LANG_CAPACITY) {
                goto error;
            }
            else if (alternateLangLength == 0) {
                /*
                 * Append the value for an unknown language, if
                 * we found no language.
                 */
                appendTag(
                    unknownLanguage,
                    (int32_t)uprv_strlen(unknownLanguage),
                    tagBuffer,
                    &tagLength);
            }
            else {
                appendTag(
                    alternateLang,
                    alternateLangLength,
                    tagBuffer,
                    &tagLength);
            }
        }

        if (scriptLength > 0) {
            appendTag(
                script,
                scriptLength,
                tagBuffer,
                &tagLength);
        }
        else if (alternateTags != NULL) {
            /*
             * Parse the alternateTags string for the script.
             */
            char alternateScript[ULOC_SCRIPT_CAPACITY];

            const int32_t alternateScriptLength =
                uloc_getScript(
                    alternateTags,
                    alternateScript,
                    sizeof(alternateScript),
                    err);

            if (U_FAILURE(*err) ||
                alternateScriptLength >= ULOC_SCRIPT_CAPACITY) {
                goto error;
            }
            else if (alternateScriptLength > 0) {
                appendTag(
                    alternateScript,
                    alternateScriptLength,
                    tagBuffer,
                    &tagLength);
            }
        }

        if (regionLength > 0) {
            appendTag(
                region,
                regionLength,
                tagBuffer,
                &tagLength);

            regionAppended = TRUE;
        }
        else if (alternateTags != NULL) {
            /*
             * Parse the alternateTags string for the region.
             */
            char alternateRegion[ULOC_COUNTRY_CAPACITY];

            const int32_t alternateRegionLength =
                uloc_getCountry(
                    alternateTags,
                    alternateRegion,
                    sizeof(alternateRegion),
                    err);
            if (U_FAILURE(*err) ||
                alternateRegionLength >= ULOC_COUNTRY_CAPACITY) {
                goto error;
            }
            else if (alternateRegionLength > 0) {
                appendTag(
                    alternateRegion,
                    alternateRegionLength,
                    tagBuffer,
                    &tagLength);

                regionAppended = TRUE;
            }
        }

        {
            const int32_t toCopy =
                tagLength >= tagCapacity ? tagCapacity : tagLength;

            /**
             * Copy the partial tag from our internal buffer to the supplied
             * target.
             **/
            uprv_memcpy(
                tag,
                tagBuffer,
                toCopy);

            capacityRemaining -= toCopy;
        }

        if (trailingLength > 0) {
            if (*trailing != '@' && capacityRemaining > 0) {
                tag[tagLength++] = '_';
                --capacityRemaining;
                if (capacityRemaining > 0 && !regionAppended) {
                    /* extra separator is required */
                    tag[tagLength++] = '_';
                    --capacityRemaining;
                }
            }

            if (capacityRemaining > 0) {
                /*
                 * Copy the trailing data into the supplied buffer.  Use uprv_memmove, since we
                 * don't know if the user-supplied buffers overlap.
                 */
                const int32_t toCopy =
                    trailingLength >= capacityRemaining ? capacityRemaining : trailingLength;

                uprv_memmove(
                    &tag[tagLength],
                    trailing,
                    toCopy);
            }
        }

        tagLength += trailingLength;

        return u_terminateChars(
                    tag,
                    tagCapacity,
                    tagLength,
                    err);
    }

error:

    /**
     * An overflow indicates the locale ID passed in
     * is ill-formed.  If we got here, and there was
     * no previous error, it's an implicit overflow.
     **/
    if (*err ==  U_BUFFER_OVERFLOW_ERROR ||
        U_SUCCESS(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    return -1;
}